

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void do_yell(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  CHAR_DATA *ch_00;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  char cVar8;
  char cVar9;
  char *pcVar10;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  
  pcVar10 = &stack0xffffffffffffedc8;
  bVar3 = is_affected(ch,(int)gsn_silence);
  if (bVar3) {
    pcVar10 = "You cannot find the words within you.\n\r";
  }
  else if (((ch->comm[0] & 0x100000) != 0) ||
          ((bVar3 = is_shifted(ch), bVar3 && (bVar3 = is_immortal(ch), !bVar3)))) {
    pcVar10 = "You can\'t yell.\n\r";
  }
  else {
    bVar3 = is_affected(ch,(int)gsn_mangled);
    if (bVar3) {
      pcVar10 = "Your torn throat prevents you from getting the words out.\n\r";
    }
    else if (*argument == '\0') {
      pcVar10 = "Yell what?\n\r";
    }
    else {
      bVar3 = is_affected(ch,(int)gsn_imprisonvoice);
      if (bVar3) {
        pcVar10 = "Your vocal cords are frozen solid!\n\r";
      }
      else {
        bVar3 = is_affected(ch,(int)gsn_gag);
        if (bVar3) {
          act("You are gagged and cannot speak!",ch,(void *)0x0,(void *)0x0,3);
          act("Muffled sounds emanate from $n\'s direction as $e attempts in vain to speak through $s gag."
              ,ch,(void *)0x0,(void *)0x0,0);
          return;
        }
        bVar3 = is_affected(ch,(int)gsn_uppercut);
        if (!bVar3) {
          bVar3 = is_affected(ch,(int)gsn_deafen);
          if (bVar3) {
            cVar8 = *argument;
            pcVar5 = upstring::buf;
            if (cVar8 != '\0') {
              lVar7 = 1;
              do {
                cVar9 = cVar8 + -0x20;
                if (0x19 < (byte)(cVar8 + 0x9fU)) {
                  cVar9 = cVar8;
                }
                *pcVar5 = cVar9;
                pcVar5 = pcVar5 + 1;
                cVar8 = argument[lVar7];
              } while ((cVar8 != '\0') && (uVar6 = (uint)lVar7, lVar7 = lVar7 + 1, uVar6 < 0x11ff));
            }
            *pcVar5 = '\0';
            argument = palloc_string(upstring::buf);
          }
          check_ooc(ch,argument,"YELL");
          bVar4 = str_cmp(ch->name,"Karsus");
          if (((!bVar4) && (pcVar5 = strstr(argument,"eing"), pcVar5 != (char *)0x0)) &&
             (pcVar5 = strstr(argument,"being"), pcVar5 == (char *)0x0)) {
            send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
            send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
            send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
          }
          if ((ch->comm[0] & 0x400) == 0) {
            pcVar10 = "You yell \'$t\'";
          }
          else {
            pcVar5 = get_char_color(ch,"yells");
            END_COLOR(ch);
            sprintf(&stack0xffffffffffffedc8,"You yell \'%s$t%s\'",pcVar5);
          }
          act(pcVar10,ch,argument,(void *)0x0,3);
          for (pDVar1 = descriptor_list; pDVar1 != (DESCRIPTOR_DATA *)0x0; pDVar1 = pDVar1->next) {
            if (((((pDVar1->connected == 0) && (ch_00 = pDVar1->character, ch_00 != ch)) &&
                 ((pRVar2 = ch_00->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0 &&
                  ((pRVar2->area == ch->in_room->area && ((ch_00->comm[0] & 1) == 0)))))) &&
                ((pRVar2->room_flags[0] & 0x200000) == 0)) && (bVar4 = is_awake(ch_00), bVar4)) {
              pcVar10 = get_char_color(pDVar1->character,"yells");
              pcVar5 = END_COLOR(pDVar1->character);
              sprintf(&stack0xffffffffffffedc8,"$n yells \'%s$t%s\'",pcVar10,pcVar5);
              act_new(&stack0xffffffffffffedc8,ch,argument,pDVar1->character,2,4);
              bVar4 = is_affected(pDVar1->character,(int)gsn_word_of_command);
              if ((bVar4) &&
                 (pcVar10 = strstr(argument,pDVar1->character->pcdata->command[0]),
                 pcVar10 != (char *)0x0)) {
                command_execute(in_stack_ffffffffffffedc8);
              }
            }
          }
          if (bVar3) {
            free_pstring(argument);
          }
          return;
        }
        pcVar10 = "Your jaw hurts too much to move.\n\r";
      }
    }
  }
  send_to_char(pcVar10,ch);
  return;
}

Assistant:

void do_yell(CHAR_DATA *ch, char *argument)
{
	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOSHOUT) || (is_shifted(ch) && !is_immortal(ch)))
	{
		send_to_char("You can't yell.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_mangled))
	{
		send_to_char("Your torn throat prevents you from getting the words out.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Yell what?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		act("You are gagged and cannot speak!", ch, nullptr, nullptr, TO_CHAR);
		act("Muffled sounds emanate from $n's direction as $e attempts in vain to speak through $s gag.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (is_affected(ch, gsn_uppercut))
	{
		send_to_char("Your jaw hurts too much to move.\n\r", ch);
		return;
	}

	auto deaf = false;
	if (is_affected(ch, gsn_deafen))
	{
		deaf = true;
		argument = palloc_string(upstring(argument));
	}

	check_ooc(ch, argument, "YELL");

	if (!str_cmp(ch->name, "Karsus") && strstr(argument, "eing") && !strstr(argument, "being"))
	{
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
	}

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "You yell '%s$t%s'", get_char_color(ch, "yells"), END_COLOR(ch));
		act(buf, ch, argument, nullptr, TO_CHAR);
	}
	else
	{
		act("You yell '$t'", ch, argument, nullptr, TO_CHAR);
	}

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && d->character->in_room != nullptr && d->character->in_room->area == ch->in_room->area && !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			/* Can't hear yells while asleep, MORGLUM */
			if (!is_awake(d->character))
				continue;

			sprintf(buf, "$n yells '%s$t%s'", get_char_color(d->character, "yells"), END_COLOR(d->character));
			act_new(buf, ch, argument, d->character, TO_VICT, POS_SLEEPING);

			if (is_affected(d->character, gsn_word_of_command) && strstr(argument, d->character->pcdata->command[0]))
				command_execute(d->character);
		}
	}

	if (deaf)
		free_pstring(argument);
}